

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void output_rule_data(void)

{
  int local_10;
  int local_c;
  int j;
  int i;
  
  if (rflag == '\0') {
    fprintf((FILE *)output_file,"static ");
  }
  fprintf((FILE *)output_file,"int %slhs[] = {%42d,",symbol_prefix,
          (ulong)(uint)symbol_value[start_symbol]);
  local_10 = 10;
  for (local_c = 3; local_c < nrules; local_c = local_c + 1) {
    if (local_10 < 10) {
      local_10 = local_10 + 1;
    }
    else {
      if (rflag == '\0') {
        outline = outline + 1;
      }
      putc(10,(FILE *)output_file);
      local_10 = 1;
    }
    fprintf((FILE *)output_file,"%5d,",(ulong)(uint)symbol_value[rlhs[local_c]]);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fprintf((FILE *)output_file,"\n};\n");
  if (rflag == '\0') {
    fprintf((FILE *)output_file,"static ");
  }
  fprintf((FILE *)output_file,"int %slen[] = {%42d,",symbol_prefix,2);
  local_10 = 10;
  for (local_c = 3; local_c < nrules; local_c = local_c + 1) {
    if (local_10 < 10) {
      local_10 = local_10 + 1;
    }
    else {
      if (rflag == '\0') {
        outline = outline + 1;
      }
      putc(10,(FILE *)output_file);
      local_10 = 1;
    }
    fprintf((FILE *)output_file,"%5d,",(ulong)((rrhs[local_c + 1] - rrhs[local_c]) - 1));
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fprintf((FILE *)output_file,"\n};\n");
  return;
}

Assistant:

void output_rule_data()
{
    register int i;
    register int j;

    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %slhs[] = {%42d,", symbol_prefix,
	    symbol_value[start_symbol]);

    j = 10;
    for (i = 3; i < nrules; i++)
    {
	if (j >= 10)
	{
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1;
	}
        else
	    ++j;

        fprintf(output_file, "%5d,", symbol_value[rlhs[i]]);
    }
    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");

    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %slen[] = {%42d,", symbol_prefix, 2);

    j = 10;
    for (i = 3; i < nrules; i++)
    {
	if (j >= 10)
	{
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1;
	}
	else
	  j++;

        fprintf(output_file, "%5d,", rrhs[i + 1] - rrhs[i] - 1);
    }
    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
}